

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1534.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uStack_40;
  long filetime;
  
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                  ,0x22,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar6 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                  ,0x24);
    iVar1 = 0x7c;
    goto LAB_0010234a;
  }
  iVar1 = curl_easy_getinfo(lVar4,0x20000e,&filetime);
  uVar7 = _stderr;
  if (iVar1 == 0) {
    if (filetime != -1) {
      lVar6 = 0;
      uStack_40 = 0x31;
LAB_0010233f:
      curl_mfprintf(_stderr,"%s:%d filetime init failed; expected -1 but is %ld\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                    ,uStack_40);
LAB_00102347:
      iVar1 = 2;
      goto LAB_0010234a;
    }
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar7 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar4,0x45,1);
      uVar7 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_perform(lVar4);
        uVar7 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_getinfo(lVar4,0x20000e,&filetime);
          uVar7 = _stderr;
          if (iVar1 == 0) {
            if (filetime != 0x1e) {
              lVar6 = 0;
              curl_mfprintf(_stderr,
                            "%s:%d filetime of http resource is incorrect; expected 30 but is %ld\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                            ,0x4c);
              iVar1 = 0x16;
              goto LAB_0010234a;
            }
            lVar6 = curl_easy_duphandle(lVar4);
            if (lVar6 == 0) {
              lVar6 = 0;
              curl_mfprintf(_stderr,"%s:%d curl_easy_duphandle() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                            ,0x57);
              goto LAB_00102347;
            }
            iVar1 = curl_easy_getinfo(lVar6,0x20000e,&filetime);
            uVar7 = _stderr;
            if (iVar1 == 0) {
              if (filetime == -1) {
                curl_easy_reset(lVar4);
                iVar1 = 0;
                iVar2 = curl_easy_getinfo(lVar4,0x20000e,&filetime);
                uVar7 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar7,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                                ,0x72,iVar2,uVar3);
                  iVar1 = iVar2;
                  goto LAB_0010234a;
                }
                if (filetime == -1) goto LAB_0010234a;
                uStack_40 = 0x77;
              }
              else {
                uStack_40 = 100;
              }
              goto LAB_0010233f;
            }
            uVar3 = curl_easy_strerror(iVar1);
            pcVar5 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
            uStack_40 = 0x5f;
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar5 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
            lVar6 = 0;
            uStack_40 = 0x46;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar5 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
          lVar6 = 0;
          uStack_40 = 0x3c;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar6 = 0;
        uStack_40 = 0x37;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar6 = 0;
      uStack_40 = 0x36;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar5 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
    lVar6 = 0;
    uStack_40 = 0x2c;
  }
  curl_mfprintf(uVar7,pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                ,uStack_40,iVar1,uVar3);
LAB_0010234a:
  curl_easy_cleanup(lVar4);
  curl_easy_cleanup(lVar6);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  long filetime;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that a filetime is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_FILETIME, 1L);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a filetime is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != 30) {
    fprintf(stderr, "%s:%d filetime of http resource is incorrect; "
            "expected 30 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a filetime is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a filetime is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}